

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation.cpp
# Opt level: O0

vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_> * __thiscall
ConnectTrace::GetBlocksConnected(ConnectTrace *this)

{
  long lVar1;
  reference pvVar2;
  vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_> *in_RDI;
  long in_FS_OFFSET;
  vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_> *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  pvVar2 = std::vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>::back
                     (in_stack_ffffffffffffffd8);
  if (pvVar2->pindex != (CBlockIndex *)0x0) {
    __assert_fail("!blocksConnected.back().pindex",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/validation.cpp"
                  ,0xc2d,"std::vector<PerBlockConnectTrace> &ConnectTrace::GetBlocksConnected()");
  }
  std::vector<PerBlockConnectTrace,_std::allocator<PerBlockConnectTrace>_>::pop_back
            (in_stack_ffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::vector<PerBlockConnectTrace>& GetBlocksConnected() {
        // We always keep one extra block at the end of our list because
        // blocks are added after all the conflicted transactions have
        // been filled in. Thus, the last entry should always be an empty
        // one waiting for the transactions from the next block. We pop
        // the last entry here to make sure the list we return is sane.
        assert(!blocksConnected.back().pindex);
        blocksConnected.pop_back();
        return blocksConnected;
    }